

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MarkContext.cpp
# Opt level: O0

void __thiscall Memory::MarkContext::Clear(MarkContext *this)

{
  MarkContext *this_local;
  
  PageStack<Memory::MarkContext::MarkCandidate>::Clear(&this->markStack);
  PageStack<FinalizableObject_*>::Clear(&this->trackStack);
  return;
}

Assistant:

void MarkContext::Clear()
{
    markStack.Clear();
#ifdef RECYCLER_VISITED_HOST
    preciseStack.Clear();
#endif
    trackStack.Clear();
}